

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

bool __thiscall SymbolTable::isActive(SymbolTable *this,string *name,string *curFun)

{
  pointer pvVar1;
  pointer pSVar2;
  __type _Var3;
  byte bVar4;
  mapped_type *pmVar5;
  SymbolTableElement *i;
  pointer __lhs;
  
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->funToName,curFun);
  pvVar1 = (this->symbolTable).
           super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = *(pointer *)
            ((long)&pvVar1[*pmVar5].
                    super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                    _M_impl.super__Vector_impl_data + 8);
  for (__lhs = pvVar1[*pmVar5].
               super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>._M_impl.
               super__Vector_impl_data._M_start; __lhs != pSVar2; __lhs = __lhs + 1) {
    _Var3 = std::operator==(&__lhs->name,name);
    if (_Var3) goto LAB_00113ff3;
  }
  pvVar1 = (this->symbolTable).
           super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = *(pointer *)
            ((long)&(pvVar1->
                    super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>).
                    _M_impl.super__Vector_impl_data + 8);
  for (__lhs = (pvVar1->super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>)
               ._M_impl.super__Vector_impl_data._M_start; __lhs != pSVar2; __lhs = __lhs + 1) {
    _Var3 = std::operator==(&__lhs->name,name);
    if (_Var3) goto LAB_00113ff3;
  }
  bVar4 = 0;
LAB_00113ffb:
  return (bool)(bVar4 & 1);
LAB_00113ff3:
  bVar4 = __lhs->isActive;
  goto LAB_00113ffb;
}

Assistant:

bool SymbolTable::isActive(string name, string curFun) {
    int index = funToName[curFun];
    for (auto &i : symbolTable[index]) {
        if(i.name == name) {
            return i.isActive;
        }
    }
    for (auto &i : symbolTable[0]) {
        if(i.name == name) {
            return i.isActive;
        }
    }

//    cout << "未找到该变量" << endl;
    return false;
}